

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_sync_client_definition_and_impl
          (t_rs_generator *this,string *client_impl_name)

{
  ostream *poVar1;
  string local_88;
  string local_68;
  string local_38;
  string *local_18;
  string *client_impl_name_local;
  t_rs_generator *this_local;
  
  local_18 = client_impl_name;
  client_impl_name_local = (string *)this;
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"pub struct ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_38,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"_i_prot: IP,");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,"_o_prot: OP,");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_68);
  t_generator::indent_abi_cxx11_(&local_88,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_88);
  poVar1 = std::operator<<(poVar1,"_sequence_number: i32,");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_88);
  t_generator::indent_down(&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"impl ");
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  render_sync_client_lifecycle_functions(this,local_18);
  t_generator::indent_down(&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rs_generator::render_sync_client_definition_and_impl(const string& client_impl_name) {

  // render the definition for the client struct
  f_gen_
    << "pub struct "
    << client_impl_name
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << SYNC_CLIENT_GENERIC_BOUNDS
    << " {"
    << endl;
  indent_up();
  f_gen_ << indent() << "_i_prot: IP," << endl;
  f_gen_ << indent() << "_o_prot: OP," << endl;
  f_gen_ << indent() << "_sequence_number: i32," << endl;
  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;

  // render the struct implementation
  // this includes the new() function as well as the helper send/recv methods for each service call
  f_gen_
    << "impl "
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << client_impl_name
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << SYNC_CLIENT_GENERIC_BOUNDS
    << " {"
    << endl;
  indent_up();
  render_sync_client_lifecycle_functions(client_impl_name);
  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}